

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::For_AST_Node::eval_internal(For_AST_Node *this,Dispatch_State *t_ss)

{
  element_type *peVar1;
  bool bVar2;
  element_type *peVar3;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar4;
  Scope_Push_Pop spp;
  Scope_Push_Pop local_80;
  element_type *local_78;
  undefined1 local_70 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined1 local_50 [32];
  
  local_78 = (element_type *)this;
  chaiscript::detail::Dispatch_Engine::new_scope
            ((Dispatch_Engine *)*in_RDX,(Stack_Holder *)in_RDX[1]);
  AST_Node::eval((AST_Node *)(local_50 + 0x10),
                 (Dispatch_State *)
                 ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.
                 __align);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._24_8_);
  }
  while( true ) {
    AST_Node::eval((AST_Node *)local_70,
                   *(Dispatch_State **)
                    ((long)&((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base.
                            _M_mutex + 0x10));
    bVar2 = AST_Node::get_bool_condition((Boxed_Value *)local_70);
    if ((element_type *)local_70._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
    peVar1 = local_78;
    if (!bVar2) break;
    AST_Node::eval((AST_Node *)local_50,
                   *(Dispatch_State **)
                    ((long)&((t_ss[3].m_engine._M_data)->m_conversions).m_mutex.super_mutex.
                            super___mutex_base._M_mutex + 8));
    if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
    }
    AST_Node::eval((AST_Node *)(local_70 + 0x10),
                   (Dispatch_State *)
                   ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.
                   __data.__list.__next);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  ((AST_Node *)&local_78->m_type_info)->_vptr_AST_Node = (_func_int **)0x0;
  peVar3 = (element_type *)operator_new(0x50);
  (peVar3->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar3->_vptr_AST_Node = (_func_int **)&PTR___Sp_counted_ptr_inplace_003110a8;
  (peVar3->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&peVar3->identifier = 0;
  *(undefined4 *)&(peVar3->text)._M_dataplus._M_p = 0x20;
  (peVar3->text)._M_string_length = 0;
  (peVar3->text).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(peVar3->text).field_2 + 8) = 0;
  (peVar3->location).start.line = 0;
  (peVar3->location).start.column = 0;
  *(undefined2 *)&(peVar3->location).end.line = 0;
  (((AST_Node *)&peVar1->m_type_info)->super_enable_shared_from_this<chaiscript::AST_Node>).
  _M_weak_this.super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  ((AST_Node *)&peVar1->m_type_info)->_vptr_AST_Node =
       (_func_int **)
       &(peVar3->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
        super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  detail::Scope_Push_Pop::~Scope_Push_Pop(&local_80);
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

          try {
            for (
                children[0]->eval(t_ss);
                get_bool_condition(children[1]->eval(t_ss));
                children[2]->eval(t_ss)
                ) {
              try {
                // Body of Loop
                children[3]->eval(t_ss);
              } catch (detail::Continue_Loop &) {
                // we got a continue exception, which means all of the remaining 
                // loop implementation is skipped and we just need to continue to
                // the next iteration step
              }
            }
          } catch (detail::Break_Loop &) {
            // loop broken
          }

          return Boxed_Value();
        }